

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSimplexAnalysis.cpp
# Opt level: O3

void __thiscall
HighsSimplexAnalysis::operationRecordBefore
          (HighsSimplexAnalysis *this,HighsInt operation_type,HighsInt current_count,
          double historical_density)

{
  HighsInt *pHVar1;
  int iVar2;
  
  iVar2 = this->numRow;
  pHVar1 = &this->AnIterOp[operation_type].AnIterOpNumCa;
  *pHVar1 = *pHVar1 + 1;
  if (((double)current_count / (double)iVar2 <= this->AnIterOp[operation_type].AnIterOpHyperCANCEL)
     && (historical_density <= this->AnIterOp[operation_type].AnIterOpHyperTRAN)) {
    pHVar1 = &this->AnIterOp[operation_type].AnIterOpNumHyperOp;
    *pHVar1 = *pHVar1 + 1;
  }
  return;
}

Assistant:

void HighsSimplexAnalysis::operationRecordBefore(
    const HighsInt operation_type, const HighsInt current_count,
    const double historical_density) {
  double current_density = 1.0 * current_count / numRow;
  AnIterOpRec& AnIter = AnIterOp[operation_type];
  AnIter.AnIterOpNumCa++;
  if (current_density <= AnIter.AnIterOpHyperCANCEL &&
      historical_density <= AnIter.AnIterOpHyperTRAN)
    AnIter.AnIterOpNumHyperOp++;
}